

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llvm::DWARFDebugRnglistTable,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this,DWARFDebugRnglistTable *y)

{
  bool bVar1;
  DWARFDebugRnglistTable *y_local;
  OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    DWARFDebugRnglistTable::operator=((DWARFDebugRnglistTable *)this,y);
  }
  else {
    DWARFDebugRnglistTable::DWARFDebugRnglistTable((DWARFDebugRnglistTable *)this,y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T const &y) {
    if (hasValue()) {
      value = y;
    } else {
      ::new ((void *)std::addressof(value)) T(y);
      hasVal = true;
    }
    return *this;
  }